

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmh.h
# Opt level: O0

size_t __thiscall
frozen::bits::pmh_tables<8ul,frozen::elsa<void>>::
lookup<frozen::basic_string<char>,frozen::elsa<void>>
          (pmh_tables<8ul,frozen::elsa<void>> *this,basic_string<char> *key,elsa<void> *hasher)

{
  value_type this_00;
  bool bVar1;
  size_t sVar2;
  const_reference pvVar3;
  value_type seed;
  const_reference pvVar4;
  seed_or_index local_30;
  value_type d;
  elsa<void> *hasher_local;
  basic_string<char> *key_local;
  pmh_tables<8UL,_frozen::elsa<void>_> *this_local;
  
  d.value_ = (value_type)hasher;
  sVar2 = elsa<void>::operator()(hasher,key,*(size_t *)this);
  pvVar3 = carray<frozen::bits::seed_or_index,_8UL>::operator[]
                     ((carray<frozen::bits::seed_or_index,_8UL> *)(this + 8),sVar2 & 7);
  local_30.value_ = pvVar3->value_;
  bVar1 = seed_or_index::is_seed(&local_30);
  this_00 = d;
  if (bVar1) {
    seed = seed_or_index::value(&local_30);
    sVar2 = elsa<void>::operator()((elsa<void> *)this_00.value_,key,seed);
    pvVar4 = carray<unsigned_long,_8UL>::operator[]
                       ((carray<unsigned_long,_8UL> *)(this + 0x48),sVar2 & 7);
    this_local = (pmh_tables<8UL,_frozen::elsa<void>_> *)*pvVar4;
  }
  else {
    this_local = (pmh_tables<8UL,_frozen::elsa<void>_> *)seed_or_index::value(&local_30);
  }
  return (size_t)this_local;
}

Assistant:

constexpr std::size_t lookup(const KeyType & key, const HasherType& hasher) const {
    auto const d = first_table_[hasher(key, static_cast<std::size_t>(first_seed_)) % M];
    if (!d.is_seed()) { return static_cast<std::size_t>(d.value()); } // this is narrowing std::uint64 -> std::size_t but should be fine
    else { return second_table_[hasher(key, static_cast<std::size_t>(d.value())) % M]; }
  }